

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrmpack.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  Settings settings_00;
  FILE *__stream;
  int iVar2;
  undefined8 uVar3;
  string local_c8 [48];
  string local_98 [36];
  undefined4 local_74;
  char *local_70;
  char *arg;
  undefined1 local_60 [4];
  int i;
  vector<const_char_*,_std::allocator<const_char_*>_> testinputs;
  char *pcStack_40;
  bool help;
  char *output;
  char *input;
  Settings settings;
  char **argv_local;
  int argc_local;
  
  defaults();
  output = (char *)0x0;
  pcStack_40 = (char *)0x0;
  testinputs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_60);
  arg._4_4_ = 1;
  do {
    __stream = _stderr;
    if (argc <= arg._4_4_) {
      if ((settings.target_error == 0.0) || (argc != 2)) {
        if ((output == (char *)0x0) ||
           ((pcStack_40 == (char *)0x0 ||
            ((testinputs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0)))) {
          getVersion_abi_cxx11_();
          uVar3 = std::__cxx11::string::c_str();
          fprintf(__stream,"vrmpack %s\n",uVar3);
          std::__cxx11::string::~string(local_c8);
          fprintf(_stderr,"Usage: vrmpack [options] -i input -o output\n");
          if ((testinputs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
            fprintf(_stderr,"\nBasics:\n");
            fprintf(_stderr,"\t-i file: input file to process, .vrm\n");
            fprintf(_stderr,"\t-o file: output file path, .vrm\n");
            fprintf(_stderr,
                    "\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n"
                   );
            fprintf(_stderr,"\nRun vrmpack -h to display a full list of options\n");
          }
          else {
            fprintf(_stderr,"\nBasics:\n");
            fprintf(_stderr,"\t-i file: input file to process, .vrm\n");
            fprintf(_stderr,"\t-o file: output file path, .vrm\n");
            fprintf(_stderr,"\nSimplification:\n");
            fprintf(_stderr,
                    "\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n"
                   );
            fprintf(_stderr,
                    "\t-sa: aggressively simplify to the target ratio disregarding quality\n");
            fprintf(_stderr,"\nMiscellaneous:\n");
            fprintf(_stderr,"\t-v: verbose output (print version when used without other options)\n"
                   );
            fprintf(_stderr,"\t-h: display this help and exit\n");
          }
          argv_local._4_4_ = 1;
        }
        else {
          settings_00.verbose = (int)settings.target_error;
          settings_00.target_error_aggressive = settings.simplify_debug;
          settings_00._4_4_ = input._4_4_;
          settings_00.simplify_threshold = input._0_4_;
          settings_00._8_8_ = settings._0_8_;
          argv_local._4_4_ = vrmpack(output,pcStack_40,settings_00);
        }
      }
      else {
        getVersion_abi_cxx11_();
        uVar3 = std::__cxx11::string::c_str();
        printf("vrmpack %s\n",uVar3);
        std::__cxx11::string::~string(local_98);
        argv_local._4_4_ = 0;
      }
LAB_001136f5:
      local_74 = 1;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_60);
      return argv_local._4_4_;
    }
    local_70 = argv[arg._4_4_];
    iVar2 = strcmp(local_70,"-si");
    if (((iVar2 == 0) && (arg._4_4_ + 1 < argc)) &&
       (iVar2 = isdigit((int)*argv[arg._4_4_ + 1]), iVar2 != 0)) {
      arg._4_4_ = arg._4_4_ + 1;
      dVar1 = atof(argv[arg._4_4_]);
      input._0_4_ = (float)dVar1;
    }
    else {
      iVar2 = strcmp(local_70,"-sa");
      if (iVar2 == 0) {
        input._4_4_ = CONCAT31(input._5_3_,1);
      }
      else {
        iVar2 = strcmp(local_70,"-i");
        if (((iVar2 == 0) && (arg._4_4_ + 1 < argc)) && (output == (char *)0x0)) {
          arg._4_4_ = arg._4_4_ + 1;
          output = argv[arg._4_4_];
        }
        else {
          iVar2 = strcmp(local_70,"-o");
          if (((iVar2 == 0) && (arg._4_4_ + 1 < argc)) && (pcStack_40 == (char *)0x0)) {
            arg._4_4_ = arg._4_4_ + 1;
            pcStack_40 = argv[arg._4_4_];
          }
          else {
            iVar2 = strcmp(local_70,"-v");
            if (iVar2 == 0) {
              settings.target_error = 1.4013e-45;
            }
            else {
              iVar2 = strcmp(local_70,"-vv");
              if (iVar2 == 0) {
                settings.target_error = 2.8026e-45;
              }
              else {
                iVar2 = strcmp(local_70,"-h");
                if (iVar2 == 0) {
                  testinputs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
                }
                else if (*local_70 == '-') {
                  fprintf(_stderr,"Unrecognized option %s\n",local_70);
                  argv_local._4_4_ = 1;
                  goto LAB_001136f5;
                }
              }
            }
          }
        }
      }
    }
    arg._4_4_ = arg._4_4_ + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
	Settings settings = defaults();

	const char* input = 0;
	const char* output = 0;
	bool help = false;

	std::vector<const char*> testinputs;

	for (int i = 1; i < argc; ++i)
	{
		const char* arg = argv[i];

		if (strcmp(arg, "-si") == 0 && i + 1 < argc && isdigit(argv[i + 1][0]))
		{
			settings.simplify_threshold = float(atof(argv[++i]));
		}
		else if (strcmp(arg, "-sa") == 0)
		{
			settings.simplify_aggressive = true;
		}
		else if (strcmp(arg, "-i") == 0 && i + 1 < argc && !input)
		{
			input = argv[++i];
		}
		else if (strcmp(arg, "-o") == 0 && i + 1 < argc && !output)
		{
			output = argv[++i];
		}
		else if (strcmp(arg, "-v") == 0)
		{
			settings.verbose = 1;
		}
		else if (strcmp(arg, "-vv") == 0)
		{
			settings.verbose = 2;
		}
		else if (strcmp(arg, "-h") == 0)
		{
			help = true;
		}
		else if (arg[0] == '-')
		{
			fprintf(stderr, "Unrecognized option %s\n", arg);
			return 1;
		}
	}

	// shortcut for vrmpack -v
	if (settings.verbose && argc == 2)
	{
		printf("vrmpack %s\n", getVersion().c_str());
		return 0;
	}

	if (!input || !output || help)
	{
		fprintf(stderr, "vrmpack %s\n", getVersion().c_str());
		fprintf(stderr, "Usage: vrmpack [options] -i input -o output\n");

		if (help)
		{
			fprintf(stderr, "\nBasics:\n");
			fprintf(stderr, "\t-i file: input file to process, .vrm\n");
			fprintf(stderr, "\t-o file: output file path, .vrm\n");
			fprintf(stderr, "\nSimplification:\n");
			fprintf(stderr, "\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n");
			fprintf(stderr, "\t-sa: aggressively simplify to the target ratio disregarding quality\n");
			fprintf(stderr, "\nMiscellaneous:\n");
			fprintf(stderr, "\t-v: verbose output (print version when used without other options)\n");
			fprintf(stderr, "\t-h: display this help and exit\n");
		}
		else
		{
			fprintf(stderr, "\nBasics:\n");
			fprintf(stderr, "\t-i file: input file to process, .vrm\n");
			fprintf(stderr, "\t-o file: output file path, .vrm\n");
			fprintf(stderr, "\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n");
			fprintf(stderr, "\nRun vrmpack -h to display a full list of options\n");
		}

		return 1;
	}

	return vrmpack(input, output, settings);
}